

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O1

void __thiscall
CConstructSymbolTableVisitor::CConstructSymbolTableVisitor(CConstructSymbolTableVisitor *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  FullInfo *__p;
  SymbolTable *__p_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->super_IVisitor)._vptr_IVisitor = (_func_int **)&PTR_Visit_00182a00;
  (this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  __p = (FullInfo *)operator_new(0x80);
  (__p->iName)._M_dataplus._M_p = (pointer)0x0;
  (__p->iName)._M_string_length = 0;
  (__p->iName).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__p->iName).field_2 + 8) = 0;
  (__p->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (__p->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->iName)._M_dataplus._M_p = (pointer)&(__p->iName).field_2;
  (__p->iName)._M_string_length = 0;
  (__p->iName).field_2._M_local_buf[0] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FullInfo*>(a_Stack_20,__p);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  __p_00 = (SymbolTable *)operator_new(0x38);
  (__p_00->classes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__p_00->classes)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(__p_00->classes)._M_h._M_rehash_policy = 0;
  (__p_00->classes)._M_h._M_rehash_policy._M_next_resize = 0;
  (__p_00->classes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p_00->classes)._M_h._M_element_count = 0;
  (__p_00->classes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__p_00->classes)._M_h._M_buckets = &(__p_00->classes)._M_h._M_single_bucket;
  (__p_00->classes)._M_h._M_bucket_count = 1;
  (__p_00->classes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__p_00->classes)._M_h._M_rehash_policy._M_next_resize = 0;
  (__p_00->classes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<SymbolTable*>(a_Stack_20,__p_00);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p_00;
  (this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return;
}

Assistant:

CConstructSymbolTableVisitor::CConstructSymbolTableVisitor()
{
	info = std::shared_ptr<FullInfo>( new FullInfo() );
	table = std::shared_ptr<SymbolTable>( new SymbolTable() );
}